

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O3

int mbedtls_x509_write_extensions(uchar **p,uchar *start,mbedtls_asn1_named_data *first)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  size_t len;
  
  if (first == (mbedtls_asn1_named_data *)0x0) {
    return 0;
  }
  iVar6 = 0;
  while( true ) {
    iVar1 = mbedtls_asn1_write_raw_buffer(p,start,(first->val).p + 1,(first->val).len - 1);
    if (iVar1 < 0) {
      return iVar1;
    }
    iVar2 = mbedtls_asn1_write_len(p,start,(first->val).len - 1);
    if (iVar2 < 0) {
      return iVar2;
    }
    uVar3 = mbedtls_asn1_write_tag(p,start,'\x04');
    if ((int)uVar3 < 0) {
      return uVar3;
    }
    lVar7 = (ulong)uVar3 + (ulong)(uint)(iVar2 + iVar1);
    if (*(first->val).p != '\0') {
      uVar3 = mbedtls_asn1_write_bool(p,start,1);
      if ((int)uVar3 < 0) {
        return uVar3;
      }
      lVar7 = lVar7 + (ulong)uVar3;
    }
    uVar3 = mbedtls_asn1_write_raw_buffer(p,start,(first->oid).p,(first->oid).len);
    if ((int)uVar3 < 0) {
      return uVar3;
    }
    uVar4 = mbedtls_asn1_write_len(p,start,(first->oid).len);
    if ((int)uVar4 < 0) {
      return uVar4;
    }
    uVar5 = mbedtls_asn1_write_tag(p,start,'\x06');
    if ((int)uVar5 < 0) {
      return uVar5;
    }
    len = lVar7 + (ulong)uVar5 + (ulong)uVar4 + (ulong)uVar3;
    iVar1 = mbedtls_asn1_write_len(p,start,len);
    if (iVar1 < 0) {
      return iVar1;
    }
    iVar2 = mbedtls_asn1_write_tag(p,start,'0');
    if (iVar2 < 0) break;
    iVar2 = iVar1 + (int)len + iVar2;
    if (iVar2 < 0) {
      return iVar2;
    }
    iVar6 = iVar6 + iVar2;
    first = first->next;
    if (first == (mbedtls_asn1_named_data *)0x0) {
      return iVar6;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_write_extensions( unsigned char **p, unsigned char *start,
                           mbedtls_asn1_named_data *first )
{
    int ret;
    size_t len = 0;
    mbedtls_asn1_named_data *cur_ext = first;

    while( cur_ext != NULL )
    {
        MBEDTLS_ASN1_CHK_ADD( len, x509_write_extension( p, start, cur_ext ) );
        cur_ext = cur_ext->next;
    }

    return( (int) len );
}